

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

void __thiscall
pbrt::Image::CopyRectOut(Image *this,Bounds2i *extent,span<float> buf,WrapMode2D wrapMode)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  PixelFormat PVar4;
  Half *pHVar5;
  float *pfVar6;
  Tuple2<pbrt::Point2,_int> TVar7;
  ulong uVar8;
  bool bVar9;
  size_t sVar10;
  WrapMode WVar11;
  ulong uVar12;
  uint uVar13;
  float *pfVar14;
  int iVar15;
  ulong uVar16;
  char *args;
  int iVar17;
  char *args_1;
  size_t sVar18;
  long lVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  float fVar23;
  span<const_unsigned_char> vin;
  span<const_unsigned_char> vin_00;
  span<const_unsigned_char> vin_01;
  span<const_unsigned_char> vin_02;
  span<const_unsigned_char> vin_03;
  span<const_unsigned_char> vin_04;
  span<float> vout;
  span<float> vout_00;
  span<float> vout_01;
  span<float> vout_02;
  span<float> vout_03;
  span<float> vout_04;
  int local_68;
  int vb;
  size_t va;
  int local_54;
  Bounds2i *local_50;
  int local_44;
  array<pbrt::WrapMode,_2> local_40;
  ulong local_38;
  
  uVar12 = buf.n;
  pfVar14 = buf.ptr;
  iVar20 = (extent->pMax).super_Tuple2<pbrt::Point2,_int>.x;
  iVar2 = (extent->pMin).super_Tuple2<pbrt::Point2,_int>.x;
  local_68 = (extent->pMin).super_Tuple2<pbrt::Point2,_int>.y;
  local_54 = iVar20 - iVar2;
  iVar3 = (extent->pMax).super_Tuple2<pbrt::Point2,_int>.y;
  uVar16 = (this->channelNames).nStored;
  iVar15 = (int)uVar16;
  iVar22 = local_54 * iVar15;
  vb = (iVar3 - local_68) * iVar22;
  va = uVar12;
  local_50 = extent;
  local_40 = wrapMode.wrap.values;
  if (uVar12 < (ulong)(long)vb) {
    LogFatal<char_const(&)[11],char_const(&)[28],char_const(&)[11],unsigned_long&,char_const(&)[28],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
               ,0x293,"Check failed: %s >= %s with %s = %s, %s = %s",(char (*) [11])"buf.size()",
               (char (*) [28])"extent.Area() * NChannels()",(char (*) [11])"buf.size()",&va,
               (char (*) [28])"extent.Area() * NChannels()",&vb);
  }
  PVar4 = this->format;
  va._4_4_ = buf.n._4_4_;
  if (PVar4 == Float) {
    if (iVar20 <= iVar2) goto LAB_0026c461;
    if (local_68 < iVar3) {
      TVar7 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
      uVar21 = TVar7.x;
      if ((int)((int)uVar21 >> 0x1f & uVar21) <= iVar2) {
        uVar13 = TVar7.y;
        if ((((int)((int)uVar13 >> 0x1f & uVar13) <= local_68) &&
            (iVar20 <= (int)(~((int)uVar21 >> 0x1f) & uVar21))) &&
           (iVar3 <= (int)(~((int)uVar13 >> 0x1f) & uVar13))) {
          iVar20 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
          do {
            if (0 < local_54) {
              iVar22 = (local_68 * iVar20 + iVar2) * iVar15;
              pfVar6 = (this->p32).ptr;
              iVar17 = 0;
              do {
                if (0 < iVar15) {
                  lVar19 = 0;
                  do {
                    *pfVar14 = pfVar6[iVar22 + lVar19];
                    pfVar14 = pfVar14 + 1;
                    lVar19 = lVar19 + 1;
                  } while (iVar15 != (int)lVar19);
                  iVar22 = iVar22 + (int)lVar19;
                }
                iVar17 = iVar17 + 1;
              } while (iVar17 != local_54);
            }
            local_68 = local_68 + 1;
          } while (local_68 != iVar3);
          return;
        }
      }
      vb = iVar3;
      do {
        if (0 < local_54) {
          iVar20 = 0;
          do {
            va = CONCAT44(local_68,(local_50->pMin).super_Tuple2<pbrt::Point2,_int>.x + iVar20);
            bVar9 = RemapPixelCoords((Point2i *)&va,
                                     (Point2i)(this->resolution).super_Tuple2<pbrt::Point2,_int>,
                                     (WrapMode2D)local_40.values);
            if (!bVar9) goto LAB_0026c401;
            if (0 < iVar15) {
              iVar3 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
              sVar18 = (this->channelNames).nStored;
              pfVar6 = (this->p32).ptr;
              lVar19 = 0;
              do {
                *pfVar14 = pfVar6[((int)va + (int)(va >> 0x20) * iVar3) * (int)sVar18 + lVar19];
                pfVar14 = pfVar14 + 1;
                lVar19 = lVar19 + 1;
              } while (iVar15 != (int)lVar19);
            }
            iVar20 = iVar20 + 1;
          } while (iVar20 != local_54);
        }
        local_68 = local_68 + 1;
        if ((local_50->pMax).super_Tuple2<pbrt::Point2,_int>.y <= local_68) {
          return;
        }
      } while( true );
    }
  }
  else if (PVar4 == Half) {
    if (iVar20 <= iVar2) goto LAB_0026c461;
    if (local_68 < iVar3) {
      TVar7 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
      uVar21 = TVar7.x;
      if ((int)((int)uVar21 >> 0x1f & uVar21) <= iVar2) {
        uVar13 = TVar7.y;
        if ((((int)((int)uVar13 >> 0x1f & uVar13) <= local_68) &&
            (iVar20 <= (int)(~((int)uVar21 >> 0x1f) & uVar21))) &&
           (iVar3 <= (int)(~((int)uVar13 >> 0x1f) & uVar13))) {
          iVar20 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
          do {
            if (0 < local_54) {
              iVar22 = (local_68 * iVar20 + iVar2) * iVar15;
              pHVar5 = (this->p16).ptr;
              iVar17 = 0;
              do {
                if (0 < iVar15) {
                  lVar19 = 0;
                  do {
                    uVar1 = pHVar5[iVar22 + lVar19].h;
                    uVar21 = (uint)uVar1 << 0xd;
                    if ((uVar21 & 0xf800000) == 0xf800000) {
                      fVar23 = (float)(uVar21 | 0x70000000);
                    }
                    else if ((uVar21 & 0xf800000) == 0) {
                      fVar23 = (float)(uVar21 | 0x38800000) + -6.1035156e-05;
                    }
                    else {
                      fVar23 = (float)((uVar21 & 0xfffe000) + 0x38000000);
                    }
                    *pfVar14 = (float)((int)(short)uVar1 & 0x80000000U | (uint)fVar23);
                    pfVar14 = pfVar14 + 1;
                    lVar19 = lVar19 + 1;
                  } while (iVar15 != (int)lVar19);
                  iVar22 = iVar22 + (int)lVar19;
                }
                iVar17 = iVar17 + 1;
              } while (iVar17 != local_54);
            }
            local_68 = local_68 + 1;
          } while (local_68 != iVar3);
          return;
        }
      }
      vb = iVar3;
      do {
        if (0 < local_54) {
          iVar20 = 0;
          do {
            va = CONCAT44(local_68,(local_50->pMin).super_Tuple2<pbrt::Point2,_int>.x + iVar20);
            bVar9 = RemapPixelCoords((Point2i *)&va,
                                     (Point2i)(this->resolution).super_Tuple2<pbrt::Point2,_int>,
                                     (WrapMode2D)local_40.values);
            if (!bVar9) goto LAB_0026c401;
            if (0 < iVar15) {
              iVar3 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
              sVar18 = (this->channelNames).nStored;
              pHVar5 = (this->p16).ptr;
              lVar19 = 0;
              do {
                uVar1 = pHVar5[((int)va + (int)(va >> 0x20) * iVar3) * (int)sVar18 + lVar19].h;
                uVar21 = (uint)uVar1 << 0xd;
                if ((uVar21 & 0xf800000) == 0xf800000) {
                  fVar23 = (float)(uVar21 | 0x70000000);
                }
                else if ((uVar21 & 0xf800000) == 0) {
                  fVar23 = (float)(uVar21 | 0x38800000) + -6.1035156e-05;
                }
                else {
                  fVar23 = (float)((uVar21 & 0xfffe000) + 0x38000000);
                }
                *pfVar14 = (float)((int)(short)uVar1 & 0x80000000U | (uint)fVar23);
                pfVar14 = pfVar14 + 1;
                lVar19 = lVar19 + 1;
              } while (iVar15 != (int)lVar19);
            }
            iVar20 = iVar20 + 1;
          } while (iVar20 != local_54);
        }
        local_68 = local_68 + 1;
        if ((local_50->pMax).super_Tuple2<pbrt::Point2,_int>.y <= local_68) {
          return;
        }
      } while( true );
    }
  }
  else {
    if (PVar4 != U256) {
      LogFatal(Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
               ,0x2c2,"Unhandled PixelFormat");
    }
    uVar21 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
    if ((int)((int)uVar21 >> 0x1f & uVar21) <= iVar2) {
      uVar13 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
      if ((((int)((int)uVar13 >> 0x1f & uVar13) <= local_68) &&
          (iVar20 <= (int)(~((int)uVar21 >> 0x1f) & uVar21))) &&
         (iVar3 <= (int)(~((int)uVar13 >> 0x1f) & uVar13))) {
        if ((extent->pMax).super_Tuple2<pbrt::Point2,_int>.y <= local_68) {
          return;
        }
        sVar18 = (size_t)iVar22;
        do {
          vin.ptr = (this->p8).ptr +
                    ((this->resolution).super_Tuple2<pbrt::Point2,_int>.x * local_68 +
                    (local_50->pMin).super_Tuple2<pbrt::Point2,_int>.x) *
                    (int)(this->channelNames).nStored;
          uVar16 = (this->encoding).
                   super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                   .bits;
          if (uVar16 < 0x2000000000000) {
            if (iVar22 != 0) {
              sVar10 = 0;
              do {
                pfVar14[sVar10] = (float)vin.ptr[sVar10] / 255.0;
                sVar10 = sVar10 + 1;
              } while (sVar18 != sVar10);
            }
          }
          else if ((uVar16 & 0xffff000000000000) == 0x2000000000000) {
            vin.n = sVar18;
            vout.n = sVar18;
            vout.ptr = pfVar14;
            sRGBColorEncoding::ToLinear((sRGBColorEncoding *)(uVar16 & 0xffffffffffff),vin,vout);
          }
          else {
            vin_00.n = sVar18;
            vin_00.ptr = vin.ptr;
            vout_00.n = sVar18;
            vout_00.ptr = pfVar14;
            GammaColorEncoding::ToLinear
                      ((GammaColorEncoding *)(uVar16 & 0xffffffffffff),vin_00,vout_00);
          }
          pfVar14 = pfVar14 + sVar18;
          local_68 = local_68 + 1;
        } while (local_68 < (local_50->pMax).super_Tuple2<pbrt::Point2,_int>.y);
        return;
      }
    }
    if (iVar20 <= iVar2) {
LAB_0026c461:
      args_1 = "extent.pMax.x";
      args = "extent.pMin.x";
      iVar15 = 0x60;
      vb = iVar20;
      goto LAB_0026c4c3;
    }
    va = CONCAT44(va._4_4_,local_68);
    if (local_68 < iVar3) {
      TVar7 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
      uVar21 = TVar7.x;
      vb = iVar3;
      if ((int)((int)uVar21 >> 0x1f & uVar21) <= iVar2) {
        uVar13 = TVar7.y;
        if ((((int)((int)uVar13 >> 0x1f & uVar13) <= local_68) &&
            (iVar20 <= (int)(~((int)uVar21 >> 0x1f) & uVar21))) &&
           (iVar3 <= (int)(~((int)uVar13 >> 0x1f) & uVar13))) {
          local_38 = uVar16;
          do {
            if (0 < local_54) {
              WVar11 = ((this->resolution).super_Tuple2<pbrt::Point2,_int>.x * local_68 +
                       (local_50->pMin).super_Tuple2<pbrt::Point2,_int>.x) *
                       (int)(this->channelNames).nStored;
              local_44 = 0;
              do {
                if (0 < (int)uVar16) {
                  local_40.values[0] = WVar11;
                  lVar19 = (long)(int)WVar11;
                  iVar20 = 0;
                  do {
                    vin_01.ptr = (this->p8).ptr + lVar19;
                    uVar12 = (this->encoding).
                             super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                             .bits;
                    if (uVar12 < 0x2000000000000) {
                      *pfVar14 = (float)*vin_01.ptr / 255.0;
                    }
                    else if ((uVar12 & 0xffff000000000000) == 0x2000000000000) {
                      vin_01.n = 1;
                      vout_01.n = 1;
                      vout_01.ptr = pfVar14;
                      sRGBColorEncoding::ToLinear
                                ((sRGBColorEncoding *)(uVar12 & 0xffffffffffff),vin_01,vout_01);
                      uVar16 = local_38;
                    }
                    else {
                      vin_02.n = 1;
                      vin_02.ptr = vin_01.ptr;
                      vout_02.n = 1;
                      vout_02.ptr = pfVar14;
                      GammaColorEncoding::ToLinear
                                ((GammaColorEncoding *)(uVar12 & 0xffffffffffff),vin_02,vout_02);
                      uVar16 = local_38;
                    }
                    pfVar14 = pfVar14 + 1;
                    iVar20 = iVar20 + -1;
                    lVar19 = lVar19 + 1;
                  } while (-iVar15 != iVar20);
                  WVar11 = local_40.values[0] - iVar20;
                }
                local_44 = local_44 + 1;
              } while (local_44 != local_54);
            }
            local_68 = local_68 + 1;
          } while (local_68 < (local_50->pMax).super_Tuple2<pbrt::Point2,_int>.y);
          return;
        }
      }
      do {
        if (0 < local_54) {
          iVar20 = 0;
          do {
            va = CONCAT44(local_68,(local_50->pMin).super_Tuple2<pbrt::Point2,_int>.x + iVar20);
            bVar9 = RemapPixelCoords((Point2i *)&va,
                                     (Point2i)(this->resolution).super_Tuple2<pbrt::Point2,_int>,
                                     (WrapMode2D)local_40.values);
            if (!bVar9) {
LAB_0026c401:
              LogFatal<char_const(&)[51]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
                         ,0x72,"Check failed: %s",
                         (char (*) [51])"RemapPixelCoords(&p, image.Resolution(), wrapMode)");
            }
            local_44 = iVar20;
            if (0 < iVar15) {
              lVar19 = (long)(((int)va +
                              (int)(va >> 0x20) *
                              (this->resolution).super_Tuple2<pbrt::Point2,_int>.x) *
                             (int)(this->channelNames).nStored);
              uVar12 = uVar16 & 0xffffffff;
              do {
                vin_03.ptr = (this->p8).ptr + lVar19;
                uVar8 = (this->encoding).
                        super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                        .bits;
                if (uVar8 < 0x2000000000000) {
                  *pfVar14 = (float)*vin_03.ptr / 255.0;
                }
                else if ((uVar8 & 0xffff000000000000) == 0x2000000000000) {
                  vin_03.n = 1;
                  vout_03.n = 1;
                  vout_03.ptr = pfVar14;
                  sRGBColorEncoding::ToLinear
                            ((sRGBColorEncoding *)(uVar8 & 0xffffffffffff),vin_03,vout_03);
                }
                else {
                  vin_04.n = 1;
                  vin_04.ptr = vin_03.ptr;
                  vout_04.n = 1;
                  vout_04.ptr = pfVar14;
                  GammaColorEncoding::ToLinear
                            ((GammaColorEncoding *)(uVar8 & 0xffffffffffff),vin_04,vout_04);
                }
                pfVar14 = pfVar14 + 1;
                lVar19 = lVar19 + 1;
                uVar21 = (int)uVar12 - 1;
                uVar12 = (ulong)uVar21;
              } while (uVar21 != 0);
            }
            iVar20 = local_44 + 1;
          } while (iVar20 != local_54);
        }
        local_68 = local_68 + 1;
        if ((local_50->pMax).super_Tuple2<pbrt::Point2,_int>.y <= local_68) {
          return;
        }
      } while( true );
    }
  }
  args_1 = "extent.pMax.y";
  args = "extent.pMin.y";
  iVar15 = 0x61;
  vb = iVar3;
  iVar2 = local_68;
LAB_0026c4c3:
  va = CONCAT44(va._4_4_,iVar2);
  LogFatal<char_const(&)[14],char_const(&)[14],char_const(&)[14],int&,char_const(&)[14],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
             ,iVar15,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [14])args,
             (char (*) [14])args_1,(char (*) [14])args,(int *)&va,(char (*) [14])args_1,&vb);
}

Assistant:

void Image::CopyRectOut(const Bounds2i &extent, pstd::span<float> buf,
                        WrapMode2D wrapMode) {
    CHECK_GE(buf.size(), extent.Area() * NChannels());

    auto bufIter = buf.begin();
    switch (format) {
    case PixelFormat::U256:
        if (Intersect(extent, Bounds2i({0, 0}, resolution)) == extent) {
            // All in bounds
            size_t count = NChannels() * (extent.pMax.x - extent.pMin.x);
            for (int y = extent.pMin.y; y < extent.pMax.y; ++y) {
                // Convert scanlines all at once.
                size_t offset = PixelOffset({extent.pMin.x, y});
#ifdef PBRT_FLOAT_AS_DOUBLE
                for (int i = 0; i < count; ++i) {
                    Float v;
                    encoding.ToLinear({&p8[offset + i], 1}, {&v, 1});
                    *bufIter++ = v;
                }
#else
                encoding.ToLinear({&p8[offset], count}, {&*bufIter, count});
#endif
                bufIter += count;
            }
        } else {
            ForExtent(extent, wrapMode, *this, [&bufIter, this](int offset) {
#ifdef PBRT_FLOAT_AS_DOUBLE
                Float v;
                encoding.ToLinear({&p8[offset], 1}, {&v, 1});
                *bufIter = v;
#else
                encoding.ToLinear({&p8[offset], 1}, {&*bufIter, 1});
#endif
                ++bufIter;
            });
        }
        break;

    case PixelFormat::Half:
        ForExtent(extent, wrapMode, *this,
                  [&bufIter, this](int offset) { *bufIter++ = Float(p16[offset]); });
        break;

    case PixelFormat::Float:
        ForExtent(extent, wrapMode, *this,
                  [&bufIter, this](int offset) { *bufIter++ = Float(p32[offset]); });
        break;

    default:
        LOG_FATAL("Unhandled PixelFormat");
    }
}